

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::SMFixIt,_false>::grow
          (SmallVectorTemplateBase<llvm::SMFixIt,_false> *this,size_t MinSize)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  SMFixIt *Dest;
  iterator pSVar4;
  iterator pSVar5;
  SMFixIt *NewElts;
  uint64_t local_20;
  size_t NewCapacity;
  size_t MinSize_local;
  SmallVectorTemplateBase<llvm::SMFixIt,_false> *this_local;
  
  NewCapacity = MinSize;
  MinSize_local = (size_t)this;
  if (0xffffffff < MinSize) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  local_20 = NextPowerOf2(sVar2 + 2);
  puVar3 = std::max<unsigned_long>(&local_20,&NewCapacity);
  NewElts = (SMFixIt *)0xffffffff;
  puVar3 = std::min<unsigned_long>(puVar3,(unsigned_long *)&NewElts);
  local_20 = *puVar3;
  Dest = (SMFixIt *)safe_malloc(local_20 * 0x30);
  pSVar4 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
  pSVar5 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
  SmallVectorTemplateBase<llvm::SMFixIt,false>::uninitialized_move<llvm::SMFixIt*,llvm::SMFixIt*>
            (pSVar4,pSVar5,Dest);
  pSVar4 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::begin
                     (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
  pSVar5 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::end
                     (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
  destroy_range(pSVar4,pSVar5);
  bVar1 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::isSmall
                    (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
  if (!bVar1) {
    pSVar4 = SmallVectorTemplateCommon<llvm::SMFixIt,_void>::begin
                       (&this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>);
    free(pSVar4);
  }
  (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.BeginX = Dest;
  (this->super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>).super_SmallVectorBase.Capacity =
       (uint)local_20;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}